

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes SzReadStreamsInfo(CSzAr *p,CSzData *sd,UInt32 numFoldersMax,CBuf *tempBufs,UInt32 numTempBufs,
                      UInt64 *dataOffset,CSubStreamInfo *ssi,ISzAlloc *alloc)

{
  Byte BVar1;
  byte bVar2;
  char cVar3;
  UInt64 UVar4;
  SRes SVar5;
  int iVar6;
  int iVar7;
  UInt32 UVar8;
  _func_void_void_ptr_void_ptr *p_Var9;
  size_t *psVar10;
  UInt32 *pUVar11;
  Byte *pBVar12;
  ulong uVar13;
  UInt64 *pUVar14;
  byte *pbVar15;
  CSzAr *pCVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  ISzAlloc *alloc_00;
  size_t sVar21;
  ulong uVar22;
  UInt32 UVar23;
  UInt32 UVar24;
  CSzAr *pCVar25;
  CSzBitUi32s *p_00;
  ulong uVar26;
  uint uVar27;
  bool bVar28;
  CSzData local_118;
  CSzAr *local_100;
  UInt32 index_1;
  UInt32 local_f4;
  ulong local_f0;
  UInt64 type;
  UInt32 numCoders;
  UInt32 numFolders;
  uint local_d4;
  size_t local_d0;
  UInt64 packSize;
  byte *local_80;
  UInt32 coderOutStreams;
  
  (ssi->sdCRCs).Data = (Byte *)0x0;
  (ssi->sdCRCs).Size = 0;
  (ssi->sdSizes).Data = (Byte *)0x0;
  (ssi->sdSizes).Size = 0;
  (ssi->sdNumSubStreams).Data = (Byte *)0x0;
  (ssi->sdNumSubStreams).Size = 0;
  *dataOffset = 0;
  SVar5 = ReadNumber(sd,&type);
  if (SVar5 != 0) {
    return SVar5;
  }
  local_f0 = CONCAT44(local_f0._4_4_,numFoldersMax);
  local_100 = p;
  if (type == 6) {
    SVar5 = ReadNumber(sd,dataOffset);
    pCVar16 = local_100;
    if (SVar5 != 0) {
      return SVar5;
    }
    SVar5 = SzReadNumber32(sd,&local_100->NumPackStreams);
    if (SVar5 != 0) {
      return SVar5;
    }
    SVar5 = WaitId(sd,9);
    if (SVar5 != 0) {
      return SVar5;
    }
    p_Var9 = (_func_void_void_ptr_void_ptr *)
             (*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)pCVar16->NumPackStreams * 8 + 8);
    pCVar16->PackPositions = (UInt64 *)p_Var9;
    if (p_Var9 == (_func_void_void_ptr_void_ptr *)0x0) {
      return 2;
    }
    uVar17 = pCVar16->NumPackStreams;
    uVar26 = 0;
    uVar18 = 0;
    while (pCVar16 = local_100, uVar17 != uVar26) {
      *(ulong *)((long)local_100->PackPositions + uVar26 * 8) = uVar18;
      SVar5 = ReadNumber(sd,&packSize);
      if (SVar5 != 0) {
        return SVar5;
      }
      uVar26 = uVar26 + 1;
      bVar28 = CARRY8(uVar18,packSize);
      uVar18 = uVar18 + packSize;
      if (bVar28) {
        return 0x10;
      }
    }
    *(ulong *)((long)local_100->PackPositions + (ulong)uVar17 * 8) = uVar18;
    do {
      SVar5 = ReadNumber(sd,&packSize);
      if (SVar5 != 0) {
        return SVar5;
      }
      if (packSize == 10) {
        iVar6 = SkipBitUi32s(sd,pCVar16->NumPackStreams);
      }
      else {
        if (packSize == 0) {
          SVar5 = ReadNumber(sd,&type);
          if (SVar5 != 0) {
            return SVar5;
          }
          break;
        }
        iVar6 = SkipData(sd);
      }
      if (iVar6 != 0) {
        return iVar6;
      }
    } while( true );
  }
  if (type == 7) {
    SVar5 = WaitId(sd,0xb);
    pCVar16 = local_100;
    if (SVar5 != 0) {
      return SVar5;
    }
    SVar5 = SzReadNumber32(sd,&numFolders);
    if (SVar5 != 0) {
      return SVar5;
    }
    uVar18 = (ulong)numFolders;
    if ((uint)local_f0 < numFolders) {
      return 4;
    }
    pCVar16->NumFolders = numFolders;
    if (sd->Size != 0) {
      sd->Size = sd->Size - 1;
      pBVar12 = sd->Data;
      sd->Data = pBVar12 + 1;
      BVar1 = *pBVar12;
      if (BVar1 == '\0') {
        local_118.Data = sd->Data;
        local_118.Size = sd->Size;
      }
      else {
        SVar5 = SzReadNumber32(sd,(UInt32 *)&packSize);
        if (SVar5 != 0) {
          return SVar5;
        }
        if (numTempBufs <= (uint)packSize) {
          return 0x10;
        }
        local_118.Data = tempBufs[packSize & 0xffffffff].data;
        local_118.Size = tempBufs[packSize & 0xffffffff].size;
      }
      psVar10 = (size_t *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,uVar18 * 8 + 8);
      pCVar16->FoCodersOffsets = psVar10;
      if (psVar10 == (size_t *)0x0) {
        return 2;
      }
      sVar21 = uVar18 * 4 + 4;
      local_f0 = uVar18;
      pUVar11 = (UInt32 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar21);
      pCVar16->FoStartPackStreamIndex = pUVar11;
      if (pUVar11 == (UInt32 *)0x0) {
        return 2;
      }
      pUVar11 = (UInt32 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar21);
      uVar18 = local_f0;
      pCVar16->FoToCoderUnpackSizes = pUVar11;
      if (pUVar11 == (UInt32 *)0x0) {
        return 2;
      }
      pBVar12 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,local_f0);
      pCVar16->FoToMainUnpackSizeIndex = pBVar12;
      if (pBVar12 == (Byte *)0x0) {
        return 2;
      }
      sVar21 = 0;
      local_f4 = 0;
      uVar17 = 0;
      local_80 = local_118.Data;
      while( true ) {
        pbVar15 = local_80;
        if (sVar21 == uVar18) break;
        pCVar16->FoCodersOffsets[sVar21] = (long)local_118.Data - (long)local_80;
        local_d0 = sVar21;
        SVar5 = SzReadNumber32(&local_118,&numCoders);
        UVar23 = numCoders;
        if (SVar5 != 0) {
          return SVar5;
        }
        uVar18 = (ulong)numCoders;
        if (numCoders - 0x41 < 0xffffffc0) {
          return 4;
        }
        uVar19 = 0;
        UVar24 = numCoders;
        local_d4 = uVar17;
        while( true ) {
          bVar28 = UVar24 == 0;
          UVar24 = UVar24 - 1;
          if (bVar28) break;
          if (local_118.Size == 0) {
            return 0x10;
          }
          bVar2 = *local_118.Data;
          if (0x3f < bVar2) {
            return 4;
          }
          uVar17 = bVar2 & 0xf;
          uVar26 = (ulong)uVar17;
          if (8 < uVar17) {
            return 4;
          }
          uVar13 = local_118.Size - 1;
          local_118.Size = uVar13 - uVar26;
          if (uVar13 < uVar26) {
            return 0x10;
          }
          local_118.Data = local_118.Data + uVar26 + 1;
          packSize = CONCAT44(packSize._4_4_,1);
          uVar17 = 1;
          if ((bVar2 & 0x10) != 0) {
            SVar5 = SzReadNumber32(&local_118,(UInt32 *)&packSize);
            if (SVar5 != 0) {
              return SVar5;
            }
            SVar5 = SzReadNumber32(&local_118,&coderOutStreams);
            if (SVar5 != 0) {
              return SVar5;
            }
            if (0x40 < (uint)packSize) {
              return 4;
            }
            uVar17 = (uint)packSize;
            if (coderOutStreams != 1) {
              return 4;
            }
          }
          uVar19 = uVar19 + uVar17;
          if (0x1f < bVar2) {
            SVar5 = SzReadNumber32(&local_118,&coderOutStreams);
            if (SVar5 != 0) {
              return SVar5;
            }
            uVar26 = (ulong)coderOutStreams;
            bVar28 = local_118.Size < uVar26;
            local_118.Size = local_118.Size - uVar26;
            if (bVar28) {
              return 0x10;
            }
            local_118.Data = local_118.Data + uVar26;
          }
        }
        if (UVar23 == 1) {
          uVar26 = 0;
          uVar27 = 1;
          if (uVar19 != 1) goto LAB_0010e723;
        }
        else {
LAB_0010e723:
          uVar27 = uVar19 - (UVar23 - 1);
          if (uVar19 < UVar23 - 1) {
            return 0x10;
          }
          if (0x40 < uVar19) {
            return 4;
          }
          for (uVar26 = 0; uVar19 != uVar26; uVar26 = uVar26 + 1) {
            *(undefined1 *)((long)&packSize + uVar26) = 0;
          }
          for (uVar26 = 0; uVar13 = uVar18, uVar18 != uVar26; uVar26 = uVar26 + 1) {
            *(undefined1 *)((long)&coderOutStreams + uVar26) = 0;
          }
          while (uVar17 = (int)uVar13 - 1, uVar17 != 0) {
            SVar5 = SzReadNumber32(&local_118,&index_1);
            if (SVar5 != 0) {
              return SVar5;
            }
            if (uVar19 <= index_1) {
              return 0x10;
            }
            if (*(char *)((long)&packSize + (ulong)index_1) != '\0') {
              return 0x10;
            }
            *(undefined1 *)((long)&packSize + (ulong)index_1) = 1;
            SVar5 = SzReadNumber32(&local_118,&index_1);
            if (SVar5 != 0) {
              return SVar5;
            }
            if (UVar23 <= index_1) {
              return 0x10;
            }
            cVar3 = *(char *)((long)&coderOutStreams + (ulong)index_1);
            *(char *)((long)&coderOutStreams + (ulong)index_1) = cVar3 + (cVar3 == '\0');
            uVar13 = (ulong)uVar17;
            if (cVar3 != '\0') {
              return 0x10;
            }
          }
          if (uVar27 != 1) {
            uVar17 = UVar23 - 2;
            while (uVar17 = uVar17 + 1, uVar19 != uVar17) {
              SVar5 = SzReadNumber32(&local_118,&index_1);
              if (SVar5 != 0) {
                return SVar5;
              }
              if (uVar19 <= index_1) {
                return 0x10;
              }
              cVar3 = *(char *)((long)&packSize + (ulong)index_1);
              *(char *)((long)&packSize + (ulong)index_1) = cVar3 + (cVar3 == '\0');
              if (cVar3 != '\0') {
                return 0x10;
              }
            }
          }
          uVar26 = 0;
          while( true ) {
            if (uVar18 == uVar26) {
              return 0x10;
            }
            if (*(char *)((long)&coderOutStreams + uVar26) == '\0') break;
            uVar26 = uVar26 + 1;
          }
          if (UVar23 == (UInt32)uVar26) {
            return 0x10;
          }
        }
        local_100->FoStartPackStreamIndex[local_d0] = local_f4;
        local_100->FoToCoderUnpackSizes[local_d0] = local_d4;
        local_100->FoToMainUnpackSizeIndex[local_d0] = (Byte)uVar26;
        uVar17 = UVar23 + local_d4;
        if (CARRY4(UVar23,local_d4)) {
          return 4;
        }
        if (local_100->NumPackStreams - local_f4 < uVar27) {
          return 0x10;
        }
        local_f4 = local_f4 + uVar27;
        sVar21 = local_d0 + 1;
        uVar18 = local_f0;
        pCVar16 = local_100;
      }
      uVar26 = (ulong)uVar17;
      pCVar16->FoToCoderUnpackSizes[uVar18] = uVar17;
      pCVar16->FoStartPackStreamIndex[uVar18] = local_f4;
      sVar21 = (long)local_118.Data - (long)local_80;
      pCVar16->FoCodersOffsets[uVar18] = sVar21;
      if (sVar21 == 0) {
        pCVar25 = (CSzAr *)0x0;
      }
      else {
        pBVar12 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar21);
        local_100->CodersData = pBVar12;
        if (pBVar12 == (Byte *)0x0) {
          return 2;
        }
        pCVar16 = local_100;
        memcpy(pBVar12,pbVar15,sVar21);
        pCVar25 = local_100;
      }
      if (BVar1 != '\0') {
        if (local_118.Size != 0) {
          return 0x10;
        }
        local_118.Data = sd->Data;
        local_118.Size = sd->Size;
      }
      SVar5 = WaitId(&local_118,0xc);
      if (SVar5 != 0) {
        return SVar5;
      }
      if (uVar17 == 0) {
        pCVar25->CoderUnpackSizes = (UInt64 *)0x0;
        uVar26 = 0;
      }
      else {
        pUVar14 = (UInt64 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,uVar26 * 8);
        pCVar25->CoderUnpackSizes = pUVar14;
        if (pUVar14 == (UInt64 *)0x0) {
          return 2;
        }
      }
      lVar20 = 0;
      while (uVar26 * 8 + 8 != lVar20 + 8) {
        SVar5 = ReadNumber(&local_118,(UInt64 *)(lVar20 + (long)pCVar25->CoderUnpackSizes));
        lVar20 = lVar20 + 8;
        if (SVar5 != 0) {
          return SVar5;
        }
      }
      p_00 = &pCVar25->FolderCRCs;
      do {
        alloc_00 = (ISzAlloc *)&packSize;
        SVar5 = ReadNumber(&local_118,&packSize);
        UVar23 = numFolders;
        if (SVar5 != 0) {
          return SVar5;
        }
        if (packSize == 10) {
          SzBitUi32s_Free(p_00,alloc_00);
          SVar5 = ReadBitVector(&local_118,UVar23,&p_00->Defs,(ISzAlloc *)pCVar16);
          if (SVar5 != 0) {
            return SVar5;
          }
          iVar6 = ReadUi32s(&local_118,UVar23,p_00,(ISzAlloc *)pCVar16);
        }
        else {
          if (packSize == 0) {
            sd->Data = local_118.Data;
            sd->Size = local_118.Size;
            SVar5 = ReadNumber(sd,&type);
            if (SVar5 != 0) {
              return SVar5;
            }
            goto LAB_0010ea25;
          }
          iVar6 = SkipData(&local_118);
        }
        if (iVar6 != 0) {
          return iVar6;
        }
      } while( true );
    }
  }
  else {
LAB_0010ea25:
    if (type != 8) {
      ssi->NumTotalSubStreams = local_100->NumFolders;
LAB_0010eb4b:
      return (uint)(type != 0) << 2;
    }
    packSize = 0;
    UVar23 = local_100->NumFolders;
    iVar6 = 0;
    local_f0 = CONCAT44(local_f0._4_4_,UVar23);
    UVar24 = 0;
    while( true ) {
      SVar5 = ReadNumber(sd,&packSize);
      UVar4 = packSize;
      if (SVar5 != 0) {
        return SVar5;
      }
      if ((packSize - 9 < 2) || (packSize == 0)) break;
      if (packSize == 0xd) {
        (ssi->sdNumSubStreams).Data = sd->Data;
        UVar23 = 0;
        UVar24 = 0;
        for (uVar17 = 0; (uint)local_f0 != uVar17; uVar17 = uVar17 + 1) {
          SVar5 = SzReadNumber32(sd,&coderOutStreams);
          if (SVar5 != 0) {
            return SVar5;
          }
          bVar28 = CARRY4(UVar23,coderOutStreams);
          UVar23 = UVar23 + coderOutStreams;
          if (bVar28) {
            return 4;
          }
          iVar7 = coderOutStreams - 1;
          bVar28 = iVar7 != 0;
          if (coderOutStreams == 0) {
            iVar7 = 0;
          }
          if (((bVar28) || (pBVar12 = (local_100->FolderCRCs).Defs, pBVar12 == (Byte *)0x0)) ||
             (-1 < (char)(pBVar12[uVar17 >> 3] << ((byte)uVar17 & 7)))) {
            UVar24 = UVar24 + coderOutStreams;
          }
          iVar6 = iVar6 + iVar7;
        }
        (ssi->sdNumSubStreams).Size = (long)sd->Data - (long)(ssi->sdNumSubStreams).Data;
      }
      else {
        SVar5 = SkipData(sd);
        if (SVar5 != 0) {
          return SVar5;
        }
      }
    }
    if ((ssi->sdNumSubStreams).Data == (Byte *)0x0) {
      pBVar12 = (local_100->FolderCRCs).Defs;
      UVar24 = (uint)local_f0;
      if (pBVar12 != (Byte *)0x0) {
        UVar8 = CountDefinedBits(pBVar12,(uint)local_f0);
        UVar24 = UVar24 - UVar8;
      }
    }
    ssi->NumTotalSubStreams = UVar23;
    ssi->NumSubDigests = UVar24;
    if (UVar4 != 9) {
LAB_0010ec4a:
      do {
        if (packSize == 10) {
          (ssi->sdCRCs).Data = sd->Data;
          SVar5 = SkipBitUi32s(sd,UVar24);
          if (SVar5 != 0) {
            return SVar5;
          }
          (ssi->sdCRCs).Size = (long)sd->Data - (long)(ssi->sdCRCs).Data;
        }
        else {
          if (packSize == 0) {
            SVar5 = ReadNumber(sd,&type);
            if (SVar5 != 0) {
              return SVar5;
            }
            goto LAB_0010eb4b;
          }
          SVar5 = SkipData(sd);
          if (SVar5 != 0) {
            return SVar5;
          }
        }
        SVar5 = ReadNumber(sd,&packSize);
        if (SVar5 != 0) {
          return SVar5;
        }
      } while( true );
    }
    pbVar15 = sd->Data;
    (ssi->sdSizes).Data = pbVar15;
    uVar18 = sd->Size;
    do {
      while( true ) {
        while( true ) {
          bVar28 = iVar6 == 0;
          iVar6 = iVar6 + -1;
          if (bVar28) {
            sd->Data = pbVar15;
            sd->Size = uVar18;
            (ssi->sdSizes).Size = (long)pbVar15 - (long)(ssi->sdSizes).Data;
            SVar5 = ReadNumber(sd,&packSize);
            if (SVar5 != 0) {
              return SVar5;
            }
            goto LAB_0010ec4a;
          }
          if (uVar18 == 0) {
            return 0x10;
          }
          uVar26 = uVar18 - 1;
          bVar2 = *pbVar15;
          if ((char)bVar2 < '\0') break;
          pbVar15 = pbVar15 + 1;
          uVar18 = uVar26;
        }
        if ((bVar2 & 0x40) != 0) break;
        if (uVar26 == 0) {
          return 0x10;
        }
        uVar18 = uVar18 - 2;
        pbVar15 = pbVar15 + 2;
      }
      pbVar15 = pbVar15 + 3;
      uVar18 = uVar18 - 3;
      uVar22 = 2;
      for (uVar13 = 0x20; ((uint)uVar22 < 8 && (((uint)uVar13 & (uint)bVar2) != 0));
          uVar13 = uVar13 >> 1) {
        pbVar15 = pbVar15 + 1;
        uVar18 = uVar18 - 1;
        uVar22 = uVar22 + 1;
      }
    } while (uVar22 <= uVar26);
  }
  return 0x10;
}

Assistant:

static SRes SzReadStreamsInfo(CSzAr *p,
    CSzData *sd,
    UInt32 numFoldersMax, const CBuf *tempBufs, UInt32 numTempBufs,
    UInt64 *dataOffset,
    CSubStreamInfo *ssi,
    ISzAlloc *alloc)
{
  UInt64 type;

  SzData_Clear(&ssi->sdSizes);
  SzData_Clear(&ssi->sdCRCs);
  SzData_Clear(&ssi->sdNumSubStreams);

  *dataOffset = 0;
  RINOK(ReadID(sd, &type));
  if (type == k7zIdPackInfo)
  {
    RINOK(ReadNumber(sd, dataOffset));
    RINOK(ReadPackInfo(p, sd, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdUnpackInfo)
  {
    RINOK(ReadUnpackInfo(p, sd, numFoldersMax, tempBufs, numTempBufs, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdSubStreamsInfo)
  {
    RINOK(ReadSubStreamsInfo(p, sd, ssi));
    RINOK(ReadID(sd, &type));
  }
  else
  {
    ssi->NumTotalSubStreams = p->NumFolders;
    /* ssi->NumSubDigests = 0; */
  }

  return (type == k7zIdEnd ? SZ_OK : SZ_ERROR_UNSUPPORTED);
}